

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

void Nf_ManUpdateStats(Nf_Man_t *p)

{
  Gia_Man_t *p_00;
  uint uVar1;
  int iVar2;
  Nf_Mat_t *pNVar3;
  int *piVar4;
  Mio_Cell2_t *pMVar5;
  Gia_Obj_t *pObj_00;
  bool bVar6;
  int *pCut;
  int local_30;
  int Id;
  int c;
  int i;
  Mio_Cell2_t *pCell;
  Gia_Obj_t *pObj;
  Nf_Mat_t *pM;
  Nf_Man_t *p_local;
  
  p->pPars->MapAreaF = 0.0;
  p->nInvs = 0;
  p->pPars->Edge = 0;
  p->pPars->Area = 0;
  Id = p->pGia->nObjs;
  while( true ) {
    Id = Id + -1;
    bVar6 = false;
    if (0 < Id) {
      pCell = (Mio_Cell2_t *)Gia_ManObj(p->pGia,Id);
      bVar6 = pCell != (Mio_Cell2_t *)0x0;
    }
    if (!bVar6) break;
    iVar2 = Gia_ObjIsAnd((Gia_Obj_t *)pCell);
    if (iVar2 != 0) {
      iVar2 = Gia_ObjIsBuf((Gia_Obj_t *)pCell);
      if (iVar2 == 0) {
        for (local_30 = 0; local_30 < 2; local_30 = local_30 + 1) {
          iVar2 = Nf_ObjMapRefNum(p,Id,local_30);
          if (iVar2 != 0) {
            pNVar3 = Nf_ObjMatchBest(p,Id,local_30);
            if ((*(uint *)pNVar3 >> 0x1e & 1) == 0) {
              piVar4 = Nf_ObjCutSet(p,Id);
              piVar4 = Nf_CutFromHandle(piVar4,*(uint *)pNVar3 >> 0x14 & 0x3ff);
              pMVar5 = Nf_ManCell(p,*(uint *)pNVar3 & 0xfffff);
              uVar1 = Nf_CutSize(piVar4);
              if (uVar1 != *(uint *)&pMVar5->field_0x10 >> 0x1c) {
                __assert_fail("Nf_CutSize(pCut) == (int)pCell->nFanins",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                              ,0x865,"void Nf_ManUpdateStats(Nf_Man_t *)");
              }
              p->pPars->MapAreaF = pMVar5->AreaF + p->pPars->MapAreaF;
              iVar2 = Nf_CutSize(piVar4);
              p->pPars->Edge = (long)iVar2 + p->pPars->Edge;
              p->pPars->Area = p->pPars->Area + 1;
            }
            else {
              p->pPars->MapAreaF = p->InvAreaF + p->pPars->MapAreaF;
              p->pPars->Edge = p->pPars->Edge + 1;
              p->pPars->Area = p->pPars->Area + 1;
              p->nInvs = p->nInvs + 1;
            }
          }
        }
      }
      else {
        iVar2 = Nf_ObjMapRefNum(p,Id,1);
        if (iVar2 != 0) {
          p->pPars->MapAreaF = p->InvAreaF + p->pPars->MapAreaF;
          p->pPars->Edge = p->pPars->Edge + 1;
          p->pPars->Area = p->pPars->Area + 1;
          p->nInvs = p->nInvs + 1;
        }
      }
    }
  }
  Id = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p->pGia->vCis);
    bVar6 = false;
    if (Id < iVar2) {
      p_00 = p->pGia;
      pObj_00 = Gia_ManCi(p->pGia,Id);
      pCut._4_4_ = Gia_ObjId(p_00,pObj_00);
      bVar6 = pCut._4_4_ != 0;
    }
    if (!bVar6) break;
    iVar2 = Nf_ObjMapRefNum(p,pCut._4_4_,1);
    if (iVar2 != 0) {
      p->pPars->MapAreaF = p->InvAreaF + p->pPars->MapAreaF;
      p->pPars->Edge = p->pPars->Edge + 1;
      p->pPars->Area = p->pPars->Area + 1;
      p->nInvs = p->nInvs + 1;
    }
    Id = Id + 1;
  }
  return;
}

Assistant:

void Nf_ManUpdateStats( Nf_Man_t * p )
{
    Nf_Mat_t * pM;
    Gia_Obj_t * pObj;
    Mio_Cell2_t * pCell;
    int i, c, Id, * pCut;
    p->pPars->MapAreaF = 0; p->nInvs = 0;
    p->pPars->Area = p->pPars->Edge = 0;
    Gia_ManForEachAndReverse( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
        {
            if ( Nf_ObjMapRefNum(p, i, 1) )
            {
                p->pPars->MapAreaF += p->InvAreaF;
                p->pPars->Edge++;
                p->pPars->Area++;
                p->nInvs++;
            }
            continue;
        }
        for ( c = 0; c < 2; c++ )
        if ( Nf_ObjMapRefNum(p, i, c) )
        {
            pM = Nf_ObjMatchBest( p, i, c );
            if ( pM->fCompl )
            {
                p->pPars->MapAreaF += p->InvAreaF;
                p->pPars->Edge++;
                p->pPars->Area++;
                p->nInvs++;
                continue;
            }
            pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, i), pM->CutH );
            pCell = Nf_ManCell( p, pM->Gate );
            assert( Nf_CutSize(pCut) == (int)pCell->nFanins );
            p->pPars->MapAreaF += pCell->AreaF;
            p->pPars->Edge += Nf_CutSize(pCut);
            p->pPars->Area++;
            //printf( "%5d (%d) : Gate = %7s \n", i, c, pCell->pName );
        }
    }
    Gia_ManForEachCiId( p->pGia, Id, i )
        if ( Nf_ObjMapRefNum(p, Id, 1) )
        {
            p->pPars->MapAreaF += p->InvAreaF;
            p->pPars->Edge++;
            p->pPars->Area++;
            p->nInvs++;
        }
}